

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

void uv__fs_done(uv__work *w,int status)

{
  uv__queue *puVar1;
  undefined8 in_RAX;
  int iVar2;
  undefined4 in_register_00000034;
  
  puVar1 = w[-9].wq.next;
  iVar2 = *(int *)&puVar1[2].next;
  if (iVar2 == 0) {
    __assert_fail("uv__has_active_reqs(req->loop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/fs.c"
                  ,0x69b,"void uv__fs_done(struct uv__work *, int)");
  }
  iVar2 = iVar2 + -1;
  *(int *)&puVar1[2].next = iVar2;
  if (status == -0x7d) {
    if (w[-7].wq.next != (uv__queue *)0x0) {
      __assert_fail("req->result == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/fs.c"
                    ,0x69e,"void uv__fs_done(struct uv__work *, int)");
    }
    w[-7].wq.next = (uv__queue *)0xffffffffffffff83;
  }
  (*(code *)w[-7].loop)(&w[-9].loop,CONCAT44(in_register_00000034,status),iVar2,in_RAX);
  return;
}

Assistant:

static void uv__fs_done(struct uv__work* w, int status) {
  uv_fs_t* req;

  req = container_of(w, uv_fs_t, work_req);
  uv__req_unregister(req->loop, req);

  if (status == UV_ECANCELED) {
    assert(req->result == 0);
    req->result = UV_ECANCELED;
  }

  req->cb(req);
}